

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O2

int waserror(int status,int signal_expected)

{
  uint uVar1;
  
  uVar1 = status & 0x7f;
  return (int)((status & 0xff00U) != 0 && uVar1 == 0 ||
              uVar1 != signal_expected && 0x1ffffff < (int)(uVar1 * 0x1000000 + 0x1000000));
}

Assistant:

static int waserror(int status, int signal_expected)
{
    int was_sig = WIFSIGNALED(status);
    int was_exit = WIFEXITED(status);
    int exit_status = WEXITSTATUS(status);
    int signal_received = WTERMSIG(status);

    return ((was_sig && (signal_received != signal_expected)) ||
            (was_exit && exit_status != 0));
}